

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.h
# Opt level: O2

DiagnosticStream * __thiscall
spvtools::DiagnosticStream::operator<<(DiagnosticStream *this,char **val)

{
  std::operator<<((ostream *)this,*val);
  return this;
}

Assistant:

DiagnosticStream& operator<<(const T& val) {
    stream_ << val;
    return *this;
  }